

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.c
# Opt level: O3

int objuok(objucxdef *undoctx)

{
  int iVar1;
  ushort uVar2;
  ulong uVar3;
  
  uVar2 = undoctx->objucxprv;
  iVar1 = 0;
  if (uVar2 != undoctx->objucxhead) {
    uVar3 = (ulong)uVar2;
    if (undoctx->objucxbuf[uVar3] != '\x03') {
      do {
        if (uVar2 == undoctx->objucxtail) {
          return 0;
        }
        uVar2 = *(ushort *)(undoctx->objucxbuf + uVar3 + 1);
        uVar3 = (ulong)uVar2;
      } while (undoctx->objucxbuf[uVar3] != '\x03');
    }
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int objuok(objucxdef *undoctx)
{
    ushort prv;

    /* see if there's any more undo information */
    if (undoctx->objucxprv == undoctx->objucxhead)
        return(FALSE);

    /* look for most recent savepoint marker */
    for (prv = undoctx->objucxprv ;; )
    {
        if (undoctx->objucxbuf[prv] == OBJUSAV)
            return(TRUE);               /* found a savepoint - can add undo */

        /* if we've reached the tail, there are no more undo records */
        if (prv == undoctx->objucxtail)
            return(FALSE);                /* no savepoints - can't add undo */

        /* get previous record */
        memcpy(&prv, &undoctx->objucxbuf[prv+1], sizeof(prv));
    }
}